

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data,
                       MQTT_MESSAGE_DETAILS_LIST *mqttMsgEntry,uchar *payload,size_t len,
                       _Bool isDuplicate)

{
  uint16_t packetId;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle;
  int iVar1;
  char *pcVar2;
  STRING_HANDLE handle;
  LOGGER_LOG p_Var3;
  MQTT_MESSAGE_HANDLE handle_00;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  MQTT_MESSAGE_HANDLE mqttMsg;
  LOGGER_LOG l;
  STRING_HANDLE msgTopic;
  int result;
  _Bool isDuplicate_local;
  size_t len_local;
  uchar *payload_local;
  MQTT_MESSAGE_DETAILS_LIST *mqttMsgEntry_local;
  PMQTTTRANSPORT_HANDLE_DATA transport_data_local;
  
  iothub_message_handle = mqttMsgEntry->iotHubMessageEntry->messageHandle;
  pcVar2 = STRING_c_str(transport_data->topic_MqttEvent);
  handle = addPropertiesTouMqttMessage
                     (iothub_message_handle,pcVar2,
                      (_Bool)(transport_data->auto_url_encode_decode & 1));
  if (handle == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"publishTelemetryMsg",0x40e,1,"Failed adding properties to mqtt message");
    }
    msgTopic._0_4_ = 0x40f;
  }
  else {
    packetId = mqttMsgEntry->packet_id;
    pcVar2 = STRING_c_str(handle);
    handle_00 = mqttmessage_create_in_place(packetId,pcVar2,DELIVER_AT_LEAST_ONCE,payload,len);
    if (handle_00 == (MQTT_MESSAGE_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"publishTelemetryMsg",0x416,1,"Failed creating mqtt message");
      }
      msgTopic._0_4_ = 0x417;
    }
    else {
      iVar1 = mqttmessage_setIsDuplicateMsg(handle_00,isDuplicate);
      if (iVar1 == 0) {
        iVar1 = tickcounter_get_current_ms
                          (transport_data->msgTickCounter,&mqttMsgEntry->msgPublishTime);
        if (iVar1 == 0) {
          iVar1 = mqtt_client_publish(transport_data->mqttClient,handle_00);
          if (iVar1 == 0) {
            msgTopic._0_4_ = 0;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                        ,"publishTelemetryMsg",0x429,1,"Failed attempting to publish mqtt message");
            }
            msgTopic._0_4_ = 0x42a;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                      ,"publishTelemetryMsg",0x422,1,"Failed retrieving tickcounter info");
          }
          msgTopic._0_4_ = 0x423;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"publishTelemetryMsg",0x41d,1,"Failed setting DUP flag");
        }
        msgTopic._0_4_ = 0x41e;
      }
      mqttmessage_destroy(handle_00);
    }
    STRING_delete(handle);
  }
  return (int)msgTopic;
}

Assistant:

static int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data, MQTT_MESSAGE_DETAILS_LIST* mqttMsgEntry, const unsigned char* payload, size_t len, bool isDuplicate)
{
    int result;
    STRING_HANDLE msgTopic = addPropertiesTouMqttMessage(mqttMsgEntry->iotHubMessageEntry->messageHandle, STRING_c_str(transport_data->topic_MqttEvent), transport_data->auto_url_encode_decode);
    if (msgTopic == NULL)
    {
        LogError("Failed adding properties to mqtt message");
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE_HANDLE mqttMsg = mqttmessage_create_in_place(mqttMsgEntry->packet_id, STRING_c_str(msgTopic), DELIVER_AT_LEAST_ONCE, payload, len);
        if (mqttMsg == NULL)
        {
            LogError("Failed creating mqtt message");
            result = MU_FAILURE;
        }
        else
        {
            if (mqttmessage_setIsDuplicateMsg(mqttMsg, isDuplicate) != 0)
            {
                LogError("Failed setting DUP flag");
                result = MU_FAILURE;
            }
            else if (tickcounter_get_current_ms(transport_data->msgTickCounter, &mqttMsgEntry->msgPublishTime) != 0)
            {
                LogError("Failed retrieving tickcounter info");
                result = MU_FAILURE;
            }
            else
            {
                if (mqtt_client_publish(transport_data->mqttClient, mqttMsg) != 0)
                {
                    LogError("Failed attempting to publish mqtt message");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            mqttmessage_destroy(mqttMsg);
        }
        STRING_delete(msgTopic);
    }
    return result;
}